

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O0

int testStateFeatureHasNoDefaultShape_shouldFail(void)

{
  bool bVar1;
  ResultType RVar2;
  ModelDescription *this;
  FeatureDescription *feature;
  FeatureType *this_00;
  StateFeatureType *this_01;
  ArrayFeatureType *this_02;
  ostream *poVar3;
  Result local_e0;
  undefined4 local_b4;
  Result local_b0;
  ValidationPolicy local_85;
  allocator<char> local_81;
  undefined1 local_80 [3];
  ValidationPolicy validationPolicy;
  FeatureDescription *state;
  ModelDescription *description;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&description);
  this = CoreML::Specification::Model::mutable_description((Model *)&description);
  feature = CoreML::Specification::ModelDescription::add_state(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_80,"x",&local_81);
  setupStateFeature(feature,(string *)local_80);
  std::__cxx11::string::~string((string *)local_80);
  std::allocator<char>::~allocator(&local_81);
  this_00 = CoreML::Specification::FeatureDescription::mutable_type(feature);
  this_01 = CoreML::Specification::FeatureType::mutable_statetype(this_00);
  this_02 = CoreML::Specification::StateFeatureType::mutable_arraytype(this_01);
  CoreML::Specification::ArrayFeatureType::clear_shape(this_02);
  local_85 = validationPolicyForStateTests();
  CoreML::validateModelDescription(&local_b0,this,9,&local_85);
  bVar1 = CoreML::Result::good(&local_b0);
  CoreML::Result::~Result(&local_b0);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1d3);
    poVar3 = std::operator<<(poVar3,": error: ");
    poVar3 = std::operator<<(poVar3,
                             "!(((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_NEWEST, validationPolicy))).good())"
                            );
    poVar3 = std::operator<<(poVar3," was false, expected true.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    m._oneof_case_[0] = 1;
  }
  else {
    CoreML::validateModelDescription(&local_e0,this,9,&local_85);
    RVar2 = CoreML::Result::type(&local_e0);
    CoreML::Result::~Result(&local_e0);
    if (RVar2 == INVALID_MODEL_INTERFACE) {
      m._oneof_case_[0] = 0;
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/InterfaceTests.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x1d3);
      poVar3 = std::operator<<(poVar3,": error: ");
      poVar3 = std::operator<<(poVar3,
                               "((ResultType::INVALID_MODEL_INTERFACE)) == ((validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_NEWEST, validationPolicy)).type())"
                              );
      poVar3 = std::operator<<(poVar3," was false, expected true.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      m._oneof_case_[0] = 1;
    }
  }
  local_b4 = 1;
  CoreML::Specification::Model::~Model((Model *)&description);
  return m._oneof_case_[0];
}

Assistant:

int testStateFeatureHasNoDefaultShape_shouldFail() {
    Specification::Model m;
    auto *description = m.mutable_description();
    auto *state = description->add_state();

    setupStateFeature(state, "x");
    state->mutable_type()->mutable_statetype()->mutable_arraytype()->clear_shape();

    // Check model specification version requirements.
    auto validationPolicy = validationPolicyForStateTests();
    ML_ASSERT_BAD_WITH_TYPE(validateModelDescription(*description, MLMODEL_SPECIFICATION_VERSION_NEWEST, validationPolicy), ResultType::INVALID_MODEL_INTERFACE);

    return 0;
}